

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<kj::Own<capnp::ClientHook>_> *
kj::newPromiseAndFulfiller<kj::Own<capnp::ClientHook>>(void)

{
  RefOrVoid<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> params;
  Own<kj::_::PromiseNode> *pOVar1;
  Own<capnp::ClientHook> *pOVar2;
  Promise<kj::Own<capnp::ClientHook>_> *pPVar3;
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> *other;
  PromiseFulfillerPair<kj::Own<capnp::ClientHook>_> *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<kj::Own<capnp::ClientHook>_> promise;
  Own<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>_>
  local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> wrapper;
  
  _::WeakFulfiller<kj::Own<capnp::ClientHook>_>::make();
  params = Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_>::operator*
                     ((Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>,kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>_>
  ::~Own(&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  pOVar2 = implicitCast<kj::Own<capnp::ClientHook>*,decltype(nullptr)>(&local_68);
  pOVar1 = _::maybeChain<kj::Own<capnp::ClientHook>>(pOVar1,pOVar2);
  Promise<kj::Own<capnp::ClientHook>_>::Promise
            ((Promise<kj::Own<capnp::ClientHook>_> *)local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<kj::Own<capnp::ClientHook>>>
                     ((Promise<kj::Own<capnp::ClientHook>_> *)local_60);
  Promise<kj::Own<capnp::ClientHook>_>::Promise(&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>>>
                    ((Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>>>::
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>,void>
            ((Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>>> *)&in_RDI->fulfiller,other);
  Promise<kj::Own<capnp::ClientHook>_>::~Promise((Promise<kj::Own<capnp::ClientHook>_> *)local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_>::~Own
            ((Own<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>_>_> *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}